

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O2

void Prettify(char *buffer,int length,int k)

{
  int i;
  long lVar1;
  ulong uVar2;
  long lVar3;
  char *buffer_00;
  uint uVar4;
  
  uVar4 = k + length;
  if ((int)uVar4 < 0x16 && -1 < k) {
    lVar1 = (long)(int)uVar4;
    for (lVar3 = (long)length; lVar3 < lVar1; lVar3 = lVar3 + 1) {
      buffer[lVar3] = '0';
    }
    (buffer + lVar1)[0] = '.';
    (buffer + lVar1)[1] = '0';
    buffer[lVar1 + 2] = '\0';
  }
  else if (uVar4 - 1 < 0x15) {
    memmove(buffer + uVar4 + 1,buffer + uVar4,(long)-k);
    buffer[uVar4] = '.';
    buffer[(long)length + 1] = '\0';
  }
  else {
    if (5 < uVar4 + 5) {
      if (length == 1) {
        buffer[1] = 'e';
        buffer_00 = buffer + 2;
      }
      else {
        memmove(buffer + 2,buffer + 1,(long)(length + -1));
        buffer[1] = '.';
        buffer_00 = buffer + (long)length + 2;
        buffer[(long)length + 1] = 'e';
      }
      WriteExponent(uVar4 - 1,buffer_00);
      return;
    }
    uVar4 = 2 - uVar4;
    memmove(buffer + uVar4,buffer,(long)length);
    buffer[0] = '0';
    buffer[1] = '.';
    for (uVar2 = 2; uVar2 < uVar4; uVar2 = uVar2 + 1) {
      buffer[uVar2] = '0';
    }
    buffer[(int)(uVar4 + length)] = '\0';
  }
  return;
}

Assistant:

inline void Prettify(char* buffer, int length, int k) {
	const int kk = length + k;	// 10^(kk-1) <= v < 10^kk

	if (length <= kk && kk <= 21) {
		// 1234e7 -> 12340000000
		for (int i = length; i < kk; i++)
			buffer[i] = '0';
		buffer[kk] = '.';
		buffer[kk + 1] = '0';
		buffer[kk + 2] = '\0';
	}
	else if (0 < kk && kk <= 21) {
		// 1234e-2 -> 12.34
		memmove(&buffer[kk + 1], &buffer[kk], size_t(length - kk));
		buffer[kk] = '.';
		buffer[length + 1] = '\0';
	}
	else if (-6 < kk && kk <= 0) {
		// 1234e-6 -> 0.001234
		const int offset = 2 - kk;
		memmove(&buffer[offset], &buffer[0], size_t(length));
		buffer[0] = '0';
		buffer[1] = '.';
		for (int i = 2; i < offset; i++)
			buffer[i] = '0';
		buffer[length + offset] = '\0';
	}
	else if (length == 1) {
		// 1e30
		buffer[1] = 'e';
		WriteExponent(kk - 1, &buffer[2]);
	}
	else {
		// 1234e30 -> 1.234e33
		memmove(&buffer[2], &buffer[1], size_t(length - 1));
		buffer[1] = '.';
		buffer[length + 1] = 'e';
		WriteExponent(kk - 1, &buffer[0 + length + 2]);
	}
}